

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_slow.cc
# Opt level: O3

void absl::lts_20240722::random_internal::RandenSlow::Generate(void *keys_void,void *state_void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  uint128 w6;
  uint128 w4;
  uint128 w3;
  uint128 w2;
  uint128 w1;
  uint128 v7;
  uint128 v6;
  
  uVar9 = *state_void;
  uVar10 = *(ulong *)((long)state_void + 8);
  lVar30 = 0;
  do {
    uVar29 = 0xfffffffffffffffc;
    lVar35 = 0;
    do {
      uVar11 = *(ulong *)((long)state_void + lVar35 * 2);
      uVar12 = *(ulong *)((long)state_void + lVar35 * 2 + 8);
      uVar13 = *(undefined8 *)((long)state_void + lVar35 * 2 + 0x10);
      uVar14 = *(undefined8 *)((long)keys_void + lVar35 + 8);
      uVar1 = (uint)(uVar11 >> 0x20);
      uVar32 = *(uint *)((anonymous_namespace)::te0 + (ulong)((uint)uVar11 & 0xff) * 4) ^
               (uint)*(undefined8 *)((long)keys_void + lVar35) ^
               *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + ((uint)(uVar12 >> 0xe) & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar12 >> 0x38) * 4);
      uVar31 = (uint)((ulong)*(undefined8 *)((long)keys_void + lVar35) >> 0x20) ^
               *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (ulong)((uint)(uVar12 >> 8) & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (ulong)((ushort)(uVar12 >> 0x30) & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te3 + (uVar11 >> 0x18 & 0xff) * 4);
      uVar1 = (uint)(uVar12 >> 0x20);
      uVar34 = *(uint *)((anonymous_namespace)::te0 + (ulong)((uint)uVar12 & 0xff) * 4) ^
               (uint)uVar14 ^ *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te2 + ((uint)(uVar11 >> 0xe) & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar11 >> 0x38) * 4);
      uVar33 = (uint)((ulong)uVar14 >> 0x20) ^
               *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (ulong)((uint)(uVar11 >> 8) & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (ulong)((ushort)(uVar11 >> 0x30) & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te3 + (ulong)((uint)uVar12 >> 0x18) * 4);
      uVar14 = *(undefined8 *)((long)state_void + lVar35 * 2 + 0x18);
      uVar1 = *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar34 & 0xff) * 4);
      uVar2 = *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar33 >> 8 & 0xff) * 4);
      uVar3 = *(uint *)((anonymous_namespace)::te2 + (uVar32 >> 0xe & 0x3fc));
      uVar4 = *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar31 >> 0x18) * 4);
      uVar5 = *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar33 & 0xff) * 4);
      uVar6 = *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar32 >> 8 & 0xff) * 4);
      uVar7 = *(uint *)((anonymous_namespace)::te2 + (uVar31 >> 0xe & 0x3fc));
      uVar8 = *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar34 >> 0x18) * 4);
      *(ulong *)((long)state_void + lVar35 * 2 + 0x10) =
           CONCAT44((uint)((ulong)uVar13 >> 0x20) ^
                    *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar31 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar34 >> 8 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te2 + (uVar33 >> 0xe & 0x3fc)) ^
                    *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar32 >> 0x18) * 4),
                    *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar32 & 0xff) * 4) ^
                    (uint)uVar13 ^
                    *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar31 >> 8 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te2 + (uVar34 >> 0xe & 0x3fc)) ^
                    *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar33 >> 0x18) * 4));
      *(ulong *)((long)state_void + lVar35 * 2 + 0x18) =
           CONCAT44((uint)((ulong)uVar14 >> 0x20) ^ uVar5 ^ uVar6 ^ uVar7 ^ uVar8,
                    uVar1 ^ (uint)uVar14 ^ uVar2 ^ uVar3 ^ uVar4);
      uVar11 = *(ulong *)((long)state_void + lVar35 * 2 + 0x20);
      uVar12 = *(ulong *)((long)state_void + lVar35 * 2 + 0x28);
      uVar13 = *(undefined8 *)((long)state_void + lVar35 * 2 + 0x30);
      uVar14 = *(undefined8 *)((long)keys_void + lVar35 + 0x10);
      uVar15 = *(undefined8 *)((long)keys_void + lVar35 + 0x18);
      uVar1 = (uint)(uVar11 >> 0x20);
      uVar32 = *(uint *)((anonymous_namespace)::te0 + (ulong)((uint)uVar11 & 0xff) * 4) ^
               (uint)uVar14 ^ *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te2 + ((uint)(uVar12 >> 0xe) & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar12 >> 0x38) * 4);
      uVar31 = (uint)((ulong)uVar14 >> 0x20) ^
               *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (ulong)((uint)(uVar12 >> 8) & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (ulong)((ushort)(uVar12 >> 0x30) & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te3 + (uVar11 >> 0x18 & 0xff) * 4);
      uVar1 = (uint)(uVar12 >> 0x20);
      uVar34 = *(uint *)((anonymous_namespace)::te0 + (ulong)((uint)uVar12 & 0xff) * 4) ^
               (uint)uVar15 ^ *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar1 >> 8 & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te2 + ((uint)(uVar11 >> 0xe) & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::te3 + (uVar11 >> 0x38) * 4);
      uVar33 = (uint)((ulong)uVar15 >> 0x20) ^
               *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar1 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te1 + (ulong)((uint)(uVar11 >> 8) & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::te2 + (ulong)((ushort)(uVar11 >> 0x30) & 0xff) * 4)
               ^ *(uint *)((anonymous_namespace)::te3 + (ulong)((uint)uVar12 >> 0x18) * 4);
      uVar14 = *(undefined8 *)((long)state_void + lVar35 * 2 + 0x38);
      uVar1 = *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar34 & 0xff) * 4);
      uVar2 = *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar33 >> 8 & 0xff) * 4);
      uVar3 = *(uint *)((anonymous_namespace)::te2 + (uVar32 >> 0xe & 0x3fc));
      uVar4 = *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar31 >> 0x18) * 4);
      uVar5 = *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar33 & 0xff) * 4);
      uVar6 = *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar32 >> 8 & 0xff) * 4);
      uVar7 = *(uint *)((anonymous_namespace)::te2 + (uVar31 >> 0xe & 0x3fc));
      uVar8 = *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar34 >> 0x18) * 4);
      *(ulong *)((long)state_void + lVar35 * 2 + 0x30) =
           CONCAT44((uint)((ulong)uVar13 >> 0x20) ^
                    *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar31 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar34 >> 8 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te2 + (uVar33 >> 0xe & 0x3fc)) ^
                    *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar32 >> 0x18) * 4),
                    *(uint *)((anonymous_namespace)::te0 + (ulong)(uVar32 & 0xff) * 4) ^
                    (uint)uVar13 ^
                    *(uint *)((anonymous_namespace)::te1 + (ulong)(uVar31 >> 8 & 0xff) * 4) ^
                    *(uint *)((anonymous_namespace)::te2 + (uVar34 >> 0xe & 0x3fc)) ^
                    *(uint *)((anonymous_namespace)::te3 + (ulong)(uVar33 >> 0x18) * 4));
      *(ulong *)((long)state_void + lVar35 * 2 + 0x38) =
           CONCAT44((uint)((ulong)uVar14 >> 0x20) ^ uVar5 ^ uVar6 ^ uVar7 ^ uVar8,
                    uVar1 ^ (uint)uVar14 ^ uVar2 ^ uVar3 ^ uVar4);
      uVar29 = uVar29 + 4;
      lVar35 = lVar35 + 0x20;
    } while (uVar29 < 0xc);
    keys_void = (void *)((long)keys_void + lVar35);
    uVar13 = *(undefined8 *)((long)state_void + 0x30);
    uVar14 = *(undefined8 *)((long)state_void + 0x38);
    uVar15 = *(undefined8 *)((long)state_void + 0x60);
    uVar16 = *(undefined8 *)((long)state_void + 0x68);
    uVar17 = *state_void;
    uVar18 = *(undefined8 *)((long)state_void + 8);
    uVar19 = *(undefined8 *)((long)state_void + 0x90);
    uVar20 = *(undefined8 *)((long)state_void + 0x98);
    uVar21 = *(undefined8 *)((long)state_void + 0xa0);
    uVar22 = *(undefined8 *)((long)state_void + 0xa8);
    uVar23 = *(undefined8 *)((long)state_void + 0x10);
    uVar24 = *(undefined8 *)((long)state_void + 0x18);
    uVar25 = *(undefined8 *)((long)state_void + 0x50);
    uVar26 = *(undefined8 *)((long)state_void + 0x58);
    uVar27 = *(undefined8 *)((long)state_void + 0xc0);
    uVar28 = *(undefined8 *)((long)state_void + 200);
    *(undefined8 *)state_void = *(undefined8 *)((long)state_void + 0x70);
    *(undefined8 *)((long)state_void + 8) = *(undefined8 *)((long)state_void + 0x78);
    *(undefined8 *)((long)state_void + 0x10) = *(undefined8 *)((long)state_void + 0x20);
    *(undefined8 *)((long)state_void + 0x18) = *(undefined8 *)((long)state_void + 0x28);
    *(undefined8 *)((long)state_void + 0x20) = *(undefined8 *)((long)state_void + 0xd0);
    *(undefined8 *)((long)state_void + 0x28) = *(undefined8 *)((long)state_void + 0xd8);
    *(undefined8 *)((long)state_void + 0x30) = *(undefined8 *)((long)state_void + 0x40);
    *(undefined8 *)((long)state_void + 0x38) = *(undefined8 *)((long)state_void + 0x48);
    *(undefined8 *)((long)state_void + 0x40) = *(undefined8 *)((long)state_void + 0xb0);
    *(undefined8 *)((long)state_void + 0x48) = *(undefined8 *)((long)state_void + 0xb8);
    *(undefined8 *)((long)state_void + 0x50) = *(undefined8 *)((long)state_void + 0x80);
    *(undefined8 *)((long)state_void + 0x58) = *(undefined8 *)((long)state_void + 0x88);
    *(undefined8 *)((long)state_void + 0x60) = uVar13;
    *(undefined8 *)((long)state_void + 0x68) = uVar14;
    *(undefined8 *)((long)state_void + 0x70) = uVar15;
    *(undefined8 *)((long)state_void + 0x78) = uVar16;
    *(undefined8 *)((long)state_void + 0x80) = *(undefined8 *)((long)state_void + 0xf0);
    *(undefined8 *)((long)state_void + 0x88) = *(undefined8 *)((long)state_void + 0xf8);
    *(undefined8 *)((long)state_void + 0x90) = uVar17;
    *(undefined8 *)((long)state_void + 0x98) = uVar18;
    *(undefined8 *)((long)state_void + 0xa0) = uVar19;
    *(undefined8 *)((long)state_void + 0xa8) = uVar20;
    *(undefined8 *)((long)state_void + 0xb0) = uVar21;
    *(undefined8 *)((long)state_void + 0xb8) = uVar22;
    *(undefined8 *)((long)state_void + 0xc0) = uVar23;
    *(undefined8 *)((long)state_void + 200) = uVar24;
    *(undefined8 *)((long)state_void + 0xd0) = *(undefined8 *)((long)state_void + 0xe0);
    *(undefined8 *)((long)state_void + 0xd8) = *(undefined8 *)((long)state_void + 0xe8);
    *(undefined8 *)((long)state_void + 0xe0) = uVar25;
    *(undefined8 *)((long)state_void + 0xe8) = uVar26;
    *(undefined8 *)((long)state_void + 0xf0) = uVar27;
    *(undefined8 *)((long)state_void + 0xf8) = uVar28;
    lVar30 = lVar30 + 1;
  } while (lVar30 != 0x11);
  *(ulong *)state_void = *state_void ^ uVar9;
  *(ulong *)((long)state_void + 8) = *(ulong *)((long)state_void + 8) ^ uVar10;
  return;
}

Assistant:

void RandenSlow::Generate(const void* keys_void, void* state_void) {
  static_assert(RandenTraits::kCapacityBytes == sizeof(absl::uint128),
                "Capacity mismatch");

  auto* state = reinterpret_cast<absl::uint128*>(state_void);
  const auto* keys = reinterpret_cast<const absl::uint128*>(keys_void);

  const absl::uint128 prev_inner = state[0];

  SwapEndian(state);

  Permute(state, keys);

  SwapEndian(state);

  // Ensure backtracking resistance.
  *state ^= prev_inner;
}